

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void declareVariable(void)

{
  Local *pLVar1;
  Compiler *pCVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (current->scopeDepth != 0) {
    lVar9 = (long)current->localCount;
    if (0 < lVar9) {
      lVar8 = lVar9 + 1;
      uVar10 = lVar9 << 5 | 0x10;
      do {
        iVar7 = *(int *)((long)current->locals + (uVar10 - 0x18));
        if ((iVar7 != -1) && (iVar7 < current->scopeDepth)) break;
        if (parser.previous.length == *(int *)((long)(current->locals + -1) + uVar10)) {
          iVar7 = bcmp(parser.previous.start,*(void **)((long)current->locals + (uVar10 - 0x28)),
                       (long)parser.previous.length);
          if (iVar7 == 0) {
            errorAt(&parser.previous,"Variable with this name already declared in this scope.");
          }
        }
        lVar8 = lVar8 + -1;
        uVar10 = uVar10 - 0x20;
      } while (1 < lVar8);
    }
    pCVar2 = current;
    lVar9 = (long)current->localCount;
    if (lVar9 == 0x100) {
      errorAt(&parser.previous,"Too many local variables in function.");
      return;
    }
    current->localCount = current->localCount + 1;
    iVar7 = parser.previous.line;
    pcVar5 = parser.previous.start;
    uVar3 = parser.previous._0_8_;
    pCVar2->locals[lVar9].name.length = parser.previous.length;
    uVar6 = parser.previous._0_8_;
    pCVar2->locals[lVar9].name.line = iVar7;
    pLVar1 = pCVar2->locals + lVar9;
    parser.previous.type = (TokenType)uVar3;
    parser.previous._4_4_ = SUB84(uVar3,4);
    uVar4 = parser.previous._4_4_;
    (pLVar1->name).type = parser.previous.type;
    parser.previous._0_8_ = uVar6;
    *(undefined4 *)&(pLVar1->name).field_0x4 = uVar4;
    (pLVar1->name).start = pcVar5;
    pCVar2->locals[lVar9].depth = -1;
    pCVar2->locals[lVar9].isCaptured = false;
  }
  return;
}

Assistant:

static void declareVariable() {
    // Global variables are implicitly declared.
    if (current->scopeDepth == 0) {
        return;
    }

    Token *name = &parser.previous;

    /**
     * Current scope is on the end of array so we looking backwards
     * until we stop on the first element -> the global scope
     */
    for (int i = current->localCount - 1; i >= 0; i--) {
        Local *local = &current->locals[i];
        if (local->depth != -1 && local->depth < current->scopeDepth) {
            break;
        }

        //Check if this variable is declared in same scope twice
        if (identifiersEqual(name, &local->name)) {
            error("Variable with this name already declared in this scope.");
        }
    }
    addLocal(*name);
}